

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int EncodeStreamHook(void *input,void *data2)

{
  uint32_t *palette;
  VP8LBackwardRefs *refs;
  uint32_t *palette_00;
  VP8LHashChain *hash_chain;
  int *piVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int width;
  int height;
  uint uVar7;
  VP8LBitWriter *src;
  VP8LEncoder *enc;
  uint8_t *puVar8;
  WebPPicture *pWVar9;
  code *pcVar10;
  void *pvVar11;
  uint32_t *puVar12;
  int iVar13;
  uint uVar14;
  WebPEncodingError WVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  void *ptr;
  void *ptr_00;
  void *pvVar20;
  uint32_t *puVar21;
  uint8_t *puVar22;
  HuffmanTree *huff_tree;
  uint16_t *histogram_symbols;
  uint32_t *puVar23;
  char cVar24;
  ulong uVar25;
  long lVar26;
  int quality;
  uint uVar27;
  uint uVar28;
  undefined2 uVar29;
  ulong uVar30;
  void *pvVar31;
  long lVar32;
  byte bVar33;
  byte bVar34;
  uint32_t uVar35;
  uint uVar36;
  uint64_t nmemb;
  byte bVar37;
  uint32_t uVar38;
  ulong uVar39;
  byte bVar40;
  uint32_t uVar41;
  HuffmanTreeCode *pHVar42;
  ulong uVar43;
  uint32_t uVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  char cVar48;
  long lVar49;
  uint *puVar50;
  ulong uVar51;
  HuffmanTreeCode *huffman_code;
  uint32_t uVar52;
  bool bVar53;
  uint32_t *local_19f8;
  HuffmanTreeToken *local_19e8;
  VP8LHistogramSet *local_19e0;
  VP8LHistogram *local_19d0;
  HuffmanTreeCode *local_1990;
  int local_1954;
  int local_1950;
  int local_1948;
  uint8_t *local_1930;
  uint local_190c;
  ulong local_1908;
  ulong local_1900;
  uint32_t *local_18f8;
  ulong local_18f0;
  void *local_18e8;
  long local_18e0;
  long local_18d8;
  ulong local_18d0;
  VP8LBackwardRefs *local_18c8;
  VP8LBackwardRefs *local_18c0;
  HuffmanTreeCode *local_18b8;
  WebPPicture *local_18b0;
  long local_18a8;
  VP8LBackwardRefs *local_18a0;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  uint32_t palette_sorted [256];
  VP8LHashChain hash_chain_histogram;
  undefined8 uStack_1040;
  uint32_t idx_map [256];
  
  local_18e0 = *input;
  local_18b0 = *(WebPPicture **)((long)input + 8);
  src = *(VP8LBitWriter **)((long)input + 0x10);
  enc = *(VP8LEncoder **)((long)input + 0x18);
  iVar3 = *(int *)((long)input + 0x20);
  uVar4 = *(uint *)((long)input + 0x104);
  iVar5 = *(int *)((long)input + 0x108);
  local_18a8 = *(long *)((long)input + 0x110);
  quality = (int)*(float *)(local_18e0 + 4);
  iVar6 = *(int *)(local_18e0 + 8);
  width = local_18b0->width;
  puVar22 = src->cur_;
  puVar8 = src->buf_;
  bw_init.bits_ = src->bits_;
  bw_init.used_ = src->used_;
  bw_init._12_4_ = *(undefined4 *)&src->field_0xc;
  bw_init.buf_ = src->buf_;
  bw_init.cur_ = src->cur_;
  bw_init.end_ = src->end_;
  bw_init.error_ = src->error_;
  bw_init._44_4_ = *(undefined4 *)&src->field_0x2c;
  height = local_18b0->height;
  iVar16 = src->used_;
  local_18e8 = input;
  iVar13 = VP8LBitWriterInit(&bw_best,0);
  local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
  if ((iVar13 != 0) &&
     (((int)uVar4 < 2 || (iVar13 = VP8LBitWriterClone(src,&bw_best), iVar13 != 0)))) {
    if ((int)uVar4 < 1) {
      local_19f8._0_4_ = VP8_ENC_OK;
    }
    else {
      local_18d8 = (long)local_18e8 + 0x24;
      local_1948 = ((int)puVar22 - (int)puVar8) + (iVar16 + 7 >> 3);
      refs = enc->refs_;
      local_18a0 = enc->refs_ + 1;
      palette_00 = enc->palette_sorted_;
      palette = enc->palette_;
      hash_chain = &enc->hash_chain_;
      local_18f0 = (ulong)(height - 1);
      local_18c8 = enc->refs_ + 2;
      local_1930 = (uint8_t *)0xffffffffffffffff;
      uVar47 = 0;
      local_1954 = 0;
      local_1950 = 0;
      do {
        uVar18 = *(uint *)(local_18d8 + uVar47 * 0x1c);
        uVar14 = uVar18 & 0xfffffffe;
        enc->use_palette_ = (uint)(uVar14 == 4);
        enc->use_subtract_green_ = (uint)(uVar14 == 2);
        uVar18 = (uint)(uVar18 == 5 || (uVar18 & 0xfffffffd) == 1);
        enc->use_predict_ = uVar18;
        if ((iVar6 == 0) || (uVar14 == 4)) {
          enc->use_cross_color_ = 0;
        }
        else {
          if (iVar5 != 0) {
            uVar18 = 0;
          }
          enc->use_cross_color_ = uVar18;
        }
        enc->cache_bits_ = 0;
        VP8LBackwardRefsClear(refs);
        VP8LBackwardRefsClear(local_18a0);
        if (((*(int *)(local_18e0 + 0x5c) < 100) && (enc->use_palette_ == 0)) &&
           (enc->use_predict_ == 0)) {
          WVar15 = AllocateTransformBuffer(enc,width,height);
          local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
          if (WVar15 == VP8_ENC_OK) {
            if (enc->argb_content_ != kEncoderNearLossless) {
              iVar16 = VP8ApplyNearLossless(local_18b0,*(int *)(local_18e0 + 0x5c),enc->argb_);
              local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
              if (iVar16 == 0) goto LAB_0014073f;
            }
            enc->argb_content_ = kEncoderNearLossless;
            goto LAB_0013fa29;
          }
LAB_0014073f:
          bVar53 = false;
        }
        else {
          enc->argb_content_ = kEncoderNone;
LAB_0013fa29:
          lVar49 = uVar47 * 0x1c + local_18d8;
          uVar18 = (uint)(iVar6 == 0);
          if (enc->use_palette_ == 0) {
LAB_001403fe:
            if ((enc->argb_content_ & ~kEncoderARGB) != kEncoderNearLossless) {
              pWVar9 = enc->pic_;
              iVar16 = pWVar9->width;
              iVar13 = pWVar9->height;
              local_19f8._0_4_ = AllocateTransformBuffer(enc,iVar16,iVar13);
              if (((WebPEncodingError)local_19f8 == VP8_ENC_OK) &&
                 (local_19f8._0_4_ = VP8_ENC_OK, enc->argb_content_ != kEncoderARGB)) {
                if (0 < iVar13) {
                  puVar23 = pWVar9->argb;
                  puVar21 = enc->argb_;
                  do {
                    memcpy(puVar21,puVar23,(long)iVar16 * 4);
                    puVar23 = puVar23 + pWVar9->argb_stride;
                    puVar21 = puVar21 + iVar16;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                }
                enc->argb_content_ = kEncoderARGB;
                local_19f8._0_4_ = VP8_ENC_OK;
              }
              if ((WebPEncodingError)local_19f8 != VP8_ENC_OK) goto LAB_0014073f;
            }
            if (enc->use_subtract_green_ != 0) {
              iVar16 = enc->current_width_;
              if (0x1f < src->used_) {
                VP8LPutBitsFlushBits(src);
              }
              iVar13 = src->used_;
              src->bits_ = src->bits_ | 1L << ((byte)iVar13 & 0x3f);
              src->used_ = iVar13 + 1;
              if (0x1e < iVar13) {
                VP8LPutBitsFlushBits(src);
              }
              src->bits_ = src->bits_ | 2L << ((byte)src->used_ & 0x3f);
              src->used_ = src->used_ + 2;
              (*VP8LSubtractGreenFromBlueAndRed)(enc->argb_,iVar16 * height);
            }
            if (enc->use_predict_ != 0) {
              iVar16 = 100;
              if (enc->use_palette_ == 0) {
                iVar16 = enc->config_->near_lossless;
              }
              iVar13 = enc->current_width_;
              iVar46 = enc->transform_bits_;
              VP8LResidualImage(iVar13,height,iVar46,uVar18,enc->argb_,enc->argb_scratch_,
                                enc->transform_data_,iVar16,enc->config_->exact,
                                enc->use_subtract_green_);
              if (0x1f < src->used_) {
                VP8LPutBitsFlushBits(src);
              }
              iVar16 = src->used_;
              src->bits_ = src->bits_ | 1L << ((byte)iVar16 & 0x3f);
              src->used_ = iVar16 + 1;
              if (0x1e < iVar16) {
                VP8LPutBitsFlushBits(src);
              }
              iVar16 = src->used_;
              src->used_ = iVar16 + 2;
              if (0x1d < iVar16) {
                VP8LPutBitsFlushBits(src);
              }
              bVar34 = (byte)iVar46;
              iVar16 = 1 << (bVar34 & 0x1f);
              src->bits_ = src->bits_ | (ulong)(iVar46 - 2) << ((byte)src->used_ & 0x3f);
              src->used_ = src->used_ + 3;
              local_19f8._0_4_ =
                   EncodeImageNoHuffman
                             (src,enc->transform_data_,hash_chain,refs,
                              (iVar13 + iVar16) - 1U >> (bVar34 & 0x1f),
                              (uint)((int)local_18f0 + iVar16) >> (bVar34 & 0x1f),quality,uVar18);
              if ((WebPEncodingError)local_19f8 != VP8_ENC_OK) goto LAB_0014073f;
            }
            if (enc->use_cross_color_ != 0) {
              iVar16 = enc->current_width_;
              iVar13 = enc->transform_bits_;
              VP8LColorSpaceTransform(iVar16,height,iVar13,quality,enc->argb_,enc->transform_data_);
              if (0x1f < src->used_) {
                VP8LPutBitsFlushBits(src);
              }
              iVar46 = src->used_;
              src->bits_ = src->bits_ | 1L << ((byte)iVar46 & 0x3f);
              src->used_ = iVar46 + 1;
              if (0x1e < iVar46) {
                VP8LPutBitsFlushBits(src);
              }
              iVar46 = src->used_;
              src->bits_ = src->bits_ | 1L << ((byte)iVar46 & 0x3f);
              src->used_ = iVar46 + 2;
              if (0x1d < iVar46) {
                VP8LPutBitsFlushBits(src);
              }
              bVar34 = (byte)iVar13;
              iVar46 = 1 << (bVar34 & 0x1f);
              src->bits_ = src->bits_ | (ulong)(iVar13 - 2) << ((byte)src->used_ & 0x3f);
              src->used_ = src->used_ + 3;
              local_19f8._0_4_ =
                   EncodeImageNoHuffman
                             (src,enc->transform_data_,hash_chain,refs,
                              (iVar16 + iVar46) - 1U >> (bVar34 & 0x1f),
                              (uint)((int)local_18f0 + iVar46) >> (bVar34 & 0x1f),quality,uVar18);
              if ((WebPEncodingError)local_19f8 != VP8_ENC_OK) goto LAB_0014073f;
            }
            if (0x1f < src->used_) {
              VP8LPutBitsFlushBits(src);
            }
            src->used_ = src->used_ + 1;
            uVar14 = enc->histo_bits_;
            bVar34 = (byte)uVar14;
            iVar16 = enc->current_width_;
            uVar17 = ~(-1 << (bVar34 & 0x1f));
            uVar28 = iVar16 + uVar17 >> (bVar34 & 0x1f);
            uVar17 = uVar17 + height >> (bVar34 & 0x1f);
            local_18b8 = (HuffmanTreeCode *)(ulong)uVar17;
            local_18f8 = enc->argb_;
            uVar17 = uVar28 * uVar17;
            uVar51 = (ulong)uVar17;
            huff_tree = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
            histogram_symbols = (uint16_t *)WebPSafeMalloc(uVar51,2);
            idx_map._0_8_ = src->bits_;
            idx_map[2] = src->used_;
            idx_map[3] = *(uint32_t *)&src->field_0xc;
            idx_map._16_8_ = src->buf_;
            idx_map._24_8_ = src->cur_;
            idx_map._32_8_ = src->end_;
            idx_map[10] = src->error_;
            idx_map[0xb] = *(uint32_t *)&src->field_0x2c;
            hash_chain_histogram.offset_length_ = (uint32_t *)0x0;
            hash_chain_histogram.size_ = 0;
            hash_chain_histogram._12_4_ = 0;
            if ((((huff_tree == (HuffmanTree *)0x0) || (histogram_symbols == (uint16_t *)0x0)) ||
                (iVar13 = VP8LHashChainInit(&hash_chain_histogram,uVar17), iVar13 == 0)) ||
               (iVar13 = VP8LHashChainFill(hash_chain,quality,local_18f8,iVar16,height,uVar18),
               iVar13 == 0)) {
LAB_001408ac:
              local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
              local_1990 = (HuffmanTreeCode *)0x0;
              local_19e8 = (HuffmanTreeToken *)0x0;
              local_19d0 = (VP8LHistogram *)0x0;
              local_19e0 = (VP8LHistogramSet *)0x0;
              WVar15 = (WebPEncodingError)local_19f8;
            }
            else {
              if (iVar3 == 0) {
                local_1900 = 0;
              }
              else {
                uVar19 = enc->cache_bits_;
                if (enc->cache_bits_ == 0) {
                  uVar19 = 10;
                }
                local_1900 = (ulong)uVar19;
              }
              iVar13 = VP8LBitWriterInit((VP8LBitWriter *)palette_sorted,0);
              if ((iVar13 == 0) ||
                 (((1 < *(int *)(lVar49 + 0x18) || (*(int *)(lVar49 + 0xc) != 0)) &&
                  (iVar13 = VP8LBitWriterClone(src,(VP8LBitWriter *)palette_sorted), iVar13 == 0))))
              goto LAB_001408ac;
              if (*(int *)(lVar49 + 0x18) < 1) {
                local_1990 = (HuffmanTreeCode *)0x0;
                local_19e8 = (HuffmanTreeToken *)0x0;
                local_19d0 = (VP8LHistogram *)0x0;
                local_19e0 = (VP8LHistogramSet *)0x0;
              }
              else {
                local_18d0 = (ulong)(uVar14 - 2);
                local_1908 = 0xffffffffffffffff;
                lVar32 = 0;
                local_19e0 = (VP8LHistogramSet *)0x0;
                local_19d0 = (VP8LHistogram *)0x0;
                local_19e8 = (HuffmanTreeToken *)0x0;
                local_1990 = (HuffmanTreeCode *)0x0;
                do {
                  uVar19 = *(uint *)(lVar49 + 8 + lVar32 * 8);
                  pHVar42 = (HuffmanTreeCode *)(ulong)uVar19;
                  WVar15 = VP8LGetBackwardReferences
                                     (iVar16,height,local_18f8,quality,uVar18,uVar19,(int)local_1900
                                      ,*(int *)(lVar49 + 0xc + lVar32 * 8),hash_chain,refs,
                                      (int *)&local_190c);
                  local_19f8._0_4_ = (WebPEncodingError)pHVar42;
                  if (WVar15 == VP8_ENC_OK) {
                    lVar45 = 0;
                    WVar15 = VP8_ENC_OK;
                    do {
                      uVar39 = 0;
                      if (lVar45 == 0) {
                        uVar39 = (ulong)local_190c;
                      }
                      cVar48 = '\x06';
                      if (lVar45 != 1 || local_190c != 0) {
                        VP8LBitWriterReset((VP8LBitWriter *)idx_map,src);
                        iVar13 = (int)uVar39;
                        local_19e0 = VP8LAllocateHistogramSet(uVar17,iVar13);
                        local_19d0 = VP8LAllocateHistogram(iVar13);
                        cVar24 = '\x02';
                        cVar48 = '\x02';
                        if ((local_19e0 != (VP8LHistogramSet *)0x0) &&
                           (local_19d0 != (VP8LHistogram *)0x0)) {
                          local_18c0 = refs + lVar45;
                          pHVar42 = (HuffmanTreeCode *)(ulong)uVar14;
                          iVar46 = VP8LGetHistoImageSymbols
                                             (iVar16,height,local_18c0,quality,uVar18,uVar14,iVar13,
                                              local_19e0,local_19d0,histogram_symbols);
                          cVar48 = cVar24;
                          if (iVar46 != 0) {
                            uVar19 = local_19e0->size;
                            local_1990 = (HuffmanTreeCode *)
                                         WebPSafeCalloc((long)(int)uVar19 * 5,0x18);
                            if ((local_1990 != (HuffmanTreeCode *)0x0) &&
                               (iVar46 = GetHuffBitLengthsAndCodes(local_19e0,local_1990),
                               iVar46 != 0)) {
                              VP8LFreeHistogramSet(local_19e0);
                              VP8LFreeHistogram(local_19d0);
                              if (iVar13 < 1) {
                                if (0x1f < src->used_) {
                                  VP8LPutBitsFlushBits(src);
                                }
                                iVar46 = src->used_ + 1;
                              }
                              else {
                                if (0x1f < src->used_) {
                                  VP8LPutBitsFlushBits(src);
                                }
                                iVar46 = src->used_;
                                src->bits_ = src->bits_ | 1L << ((byte)iVar46 & 0x3f);
                                src->used_ = iVar46 + 1;
                                if (0x1e < iVar46) {
                                  VP8LPutBitsFlushBits(src);
                                }
                                src->bits_ = src->bits_ | uVar39 << ((byte)src->used_ & 0x3f);
                                iVar46 = src->used_ + 4;
                              }
                              src->used_ = iVar46;
                              if (0x1f < iVar46) {
                                VP8LPutBitsFlushBits(src);
                              }
                              src->bits_ = src->bits_ |
                                           (ulong)(1 < (int)uVar19) << ((byte)src->used_ & 0x3f);
                              src->used_ = src->used_ + 1;
                              if (1 < (int)uVar19) {
                                puVar23 = (uint32_t *)WebPSafeMalloc(uVar51,4);
                                if (puVar23 == (uint32_t *)0x0) {
                                  cVar48 = '\x02';
                                  bVar53 = false;
                                }
                                else {
                                  uVar19 = 0;
                                  if (uVar51 != 0) {
                                    uVar39 = 0;
                                    uVar19 = 0;
                                    do {
                                      uVar2 = histogram_symbols[uVar39];
                                      puVar23[uVar39] = (uint)uVar2 << 8;
                                      if (uVar19 <= uVar2) {
                                        uVar19 = uVar2 + 1;
                                      }
                                      uVar39 = uVar39 + 1;
                                    } while (uVar51 != uVar39);
                                  }
                                  if (0x1f < src->used_) {
                                    VP8LPutBitsFlushBits(src);
                                  }
                                  src->bits_ = src->bits_ | local_18d0 << ((byte)src->used_ & 0x3f);
                                  src->used_ = src->used_ + 3;
                                  pHVar42 = local_18b8;
                                  WVar15 = EncodeImageNoHuffman
                                                     (src,puVar23,&hash_chain_histogram,local_18c8,
                                                      uVar28,(int)local_18b8,quality,uVar18);
                                  WebPSafeFree(puVar23);
                                  bVar53 = WVar15 == VP8_ENC_OK;
                                  cVar48 = !bVar53 * '\x02';
                                }
                                if (!bVar53) {
                                  local_19d0 = (VP8LHistogram *)0x0;
                                  local_19e0 = (VP8LHistogramSet *)0x0;
                                  goto LAB_00140e5a;
                                }
                              }
                              uVar27 = uVar19 * 5;
                              if ((int)uVar19 < 1) {
                                nmemb = 0;
                              }
                              else {
                                uVar39 = 1;
                                if (1 < (int)uVar27) {
                                  uVar39 = (ulong)uVar27;
                                }
                                lVar26 = 0;
                                uVar36 = 0;
                                do {
                                  uVar7 = *(uint *)((long)&local_1990->num_symbols + lVar26);
                                  if ((int)uVar7 < (int)uVar36) {
                                    uVar7 = uVar36;
                                  }
                                  uVar36 = uVar7;
                                  lVar26 = lVar26 + 0x18;
                                } while (uVar39 * 0x18 != lVar26);
                                nmemb = (uint64_t)uVar36;
                              }
                              local_19e8 = (HuffmanTreeToken *)WebPSafeMalloc(nmemb,2);
                              cVar48 = (local_19e8 == (HuffmanTreeToken *)0x0) * '\x02';
                              if ((0 < (int)uVar19) && (local_19e8 != (HuffmanTreeToken *)0x0)) {
                                if ((int)uVar27 < 2) {
                                  uVar27 = 1;
                                }
                                uVar39 = (ulong)uVar27;
                                huffman_code = local_1990;
                                do {
                                  StoreHuffmanCode(src,huff_tree,local_19e8,huffman_code);
                                  ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
                                  huffman_code = huffman_code + 1;
                                  uVar39 = uVar39 - 1;
                                } while (uVar39 != 0);
                                cVar48 = '\0';
                              }
                              if (local_19e8 != (HuffmanTreeToken *)0x0) {
                                puVar22 = src->cur_;
                                iVar46 = src->used_;
                                puVar8 = src->buf_;
                                pHVar42 = local_1990;
                                WVar15 = StoreImageToBitMask(src,iVar16,uVar14,local_18c0,
                                                             histogram_symbols,local_1990);
                                if (WVar15 == VP8_ENC_OK) {
                                  lVar26 = (long)src->cur_ - (long)src->buf_;
                                  uVar39 = (src->used_ + 7 >> 3) + lVar26;
                                  if (uVar39 < local_1908) {
                                    local_1950 = ((int)puVar22 - ((int)puVar8 + local_1948)) +
                                                 (iVar46 + 7 >> 3);
                                    enc->cache_bits_ = iVar13;
                                    local_1954 = ((int)lVar26 - (local_1948 + local_1950)) +
                                                 (src->used_ + 7 >> 3);
                                    VP8LBitWriterSwap(src,(VP8LBitWriter *)palette_sorted);
                                    local_1908 = uVar39;
                                  }
                                  WebPSafeFree(local_19e8);
                                  WebPSafeFree(local_1990->codes);
                                  WebPSafeFree(local_1990);
                                  local_1990 = (HuffmanTreeCode *)0x0;
                                  local_19e8 = (HuffmanTreeToken *)0x0;
                                  local_19d0 = (VP8LHistogram *)0x0;
                                  local_19e0 = (VP8LHistogramSet *)0x0;
                                  WVar15 = VP8_ENC_OK;
                                  cVar48 = '\0';
                                  goto LAB_00140e5a;
                                }
                                cVar48 = '\x02';
                              }
                              local_19d0 = (VP8LHistogram *)0x0;
                              local_19e0 = (VP8LHistogramSet *)0x0;
                            }
                          }
                        }
                      }
LAB_00140e5a:
                      local_19f8._0_4_ = (WebPEncodingError)pHVar42;
                      cVar24 = '\0';
                      if (cVar48 != '\0') {
                        if (cVar48 != '\x06') {
                          cVar24 = cVar48;
                        }
                        goto LAB_001411c5;
                      }
                      if ((lVar45 != 0) || (lVar45 = 1, *(int *)(lVar49 + 0xc + lVar32 * 8) == 0))
                      goto LAB_001411c5;
                    } while( true );
                  }
                  cVar24 = '\x02';
LAB_001411c5:
                  if (cVar24 != '\0') {
                    if (cVar24 != '\x02') goto LAB_00140930;
                    goto LAB_001408c1;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 < *(int *)(lVar49 + 0x18));
              }
              VP8LBitWriterSwap(src,(VP8LBitWriter *)palette_sorted);
              local_19f8._0_4_ = VP8_ENC_OK;
              WVar15 = (WebPEncodingError)local_19f8;
            }
LAB_001408c1:
            local_19f8._0_4_ = WVar15;
            WebPSafeFree(local_19e8);
            WebPSafeFree(huff_tree);
            VP8LFreeHistogramSet(local_19e0);
            VP8LFreeHistogram(local_19d0);
            VP8LHashChainClear(&hash_chain_histogram);
            if (local_1990 != (HuffmanTreeCode *)0x0) {
              WebPSafeFree(local_1990->codes);
              WebPSafeFree(local_1990);
            }
            WebPSafeFree(histogram_symbols);
            VP8LBitWriterWipeOut((VP8LBitWriter *)palette_sorted);
LAB_00140930:
            if ((WebPEncodingError)local_19f8 == VP8_ENC_OK) {
              puVar22 = src->cur_ + ((long)(src->used_ + 7 >> 3) - (long)src->buf_);
              if ((puVar22 < local_1930) &&
                 (VP8LBitWriterSwap(src,&bw_best), local_1930 = puVar22, local_18a8 != 0)) {
                *(undefined4 *)(local_18a8 + 0x94) = 0;
                uVar18 = (uint)(enc->use_predict_ != 0);
                *(uint *)(local_18a8 + 0x94) = uVar18;
                if (enc->use_cross_color_ != 0) {
                  *(uint *)(local_18a8 + 0x94) = uVar18 | 2;
                }
                if (enc->use_subtract_green_ != 0) {
                  *(byte *)(local_18a8 + 0x94) = *(byte *)(local_18a8 + 0x94) | 4;
                }
                if (enc->use_palette_ != 0) {
                  *(byte *)(local_18a8 + 0x94) = *(byte *)(local_18a8 + 0x94) | 8;
                }
                *(undefined8 *)(local_18a8 + 0x98) = *(undefined8 *)&enc->histo_bits_;
                *(int *)(local_18a8 + 0xa0) = enc->cache_bits_;
                *(int *)(local_18a8 + 0xa4) = enc->palette_size_;
                *(int *)(local_18a8 + 0xa8) = (int)puVar22 - local_1948;
                *(int *)(local_18a8 + 0xac) = local_1950;
                *(int *)(local_18a8 + 0xb0) = local_1954;
              }
              local_19f8._0_4_ = VP8_ENC_OK;
              bVar53 = true;
              if (1 < (int)uVar4) {
                VP8LBitWriterReset(&bw_init,src);
                local_19f8._0_4_ = VP8_ENC_OK;
                bVar53 = true;
              }
            }
            else {
              bVar53 = false;
            }
          }
          else {
            if (*(int *)(lVar49 + 4) == 1) {
              iVar16 = enc->palette_size_;
              uVar51 = (ulong)iVar16;
              memcpy(palette,palette_00,uVar51 * 4);
              if ((long)uVar51 < 1) {
                bVar34 = 0;
              }
              else {
                uVar39 = 0;
                bVar34 = 0;
                uVar14 = 0;
                do {
                  uVar17 = palette_00[uVar39];
                  uVar28 = (uVar17 | 0xff00) - (uVar14 & 0xff00ff);
                  uVar14 = uVar17 - (uVar14 & 0xff00);
                  uVar19 = uVar28 >> 0x10 & 0xff;
                  bVar40 = 2 - (uVar19 < 0x80);
                  if (uVar19 == 0) {
                    bVar40 = (byte)(uVar28 >> 0x10);
                  }
                  uVar19 = uVar14 >> 8 & 0xff;
                  bVar37 = (0x7f < uVar19) * '\b' + 8;
                  if (uVar19 == 0) {
                    bVar37 = (byte)(uVar14 >> 8);
                  }
                  bVar33 = 0x80;
                  if ((uVar28 & 0xff) < 0x80) {
                    bVar33 = 0x40;
                  }
                  if ((uVar28 & 0xff) == 0) {
                    bVar33 = 0;
                  }
                  bVar34 = bVar33 | bVar34 | bVar40 | bVar37;
                  uVar39 = uVar39 + 1;
                  uVar14 = uVar17;
                } while (uVar51 != uVar39);
              }
              if ((0 < iVar16) && ((bVar34 * '\x02' & bVar34) != 0)) {
                uVar39 = 0;
                uVar35 = 0;
                do {
                  uVar14 = 0xffffffff;
                  uVar43 = uVar39 & 0xffffffff;
                  uVar30 = uVar39;
                  do {
                    uVar28 = (palette[uVar30] | 0xff0000) - (uVar35 & 0xff00ff00);
                    uVar19 = (palette[uVar30] | 0xff00) - (uVar35 & 0xff00ff);
                    uVar27 = uVar19 & 0xff;
                    uVar17 = 0x100 - uVar27;
                    if (uVar27 < 0x81) {
                      uVar17 = uVar27;
                    }
                    uVar36 = uVar28 >> 8 & 0xff;
                    uVar27 = 0x100 - uVar36;
                    if (uVar36 < 0x81) {
                      uVar27 = uVar36;
                    }
                    uVar36 = uVar19 >> 0x10 & 0xff;
                    uVar19 = 0x100 - uVar36;
                    if (uVar36 < 0x81) {
                      uVar19 = uVar36;
                    }
                    uVar36 = 0x100 - (uVar28 >> 0x18);
                    if (uVar28 < 0x81000000) {
                      uVar36 = uVar28 >> 0x18;
                    }
                    uVar36 = uVar36 + (uVar19 + uVar27 + uVar17) * 9;
                    if (uVar36 < uVar14) {
                      uVar43 = uVar30 & 0xffffffff;
                    }
                    if (uVar36 <= uVar14) {
                      uVar14 = uVar36;
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar51 != uVar30);
                  uVar35 = palette[(int)uVar43];
                  palette[(int)uVar43] = palette[uVar39];
                  palette[uVar39] = uVar35;
                  uVar39 = uVar39 + 1;
                } while (uVar39 != uVar51);
              }
LAB_001400ed:
              iVar16 = enc->palette_size_;
              if (0x1f < src->used_) {
                VP8LPutBitsFlushBits(src);
              }
              iVar13 = src->used_;
              src->bits_ = src->bits_ | 1L << ((byte)iVar13 & 0x3f);
              src->used_ = iVar13 + 1;
              if (0x1e < iVar13) {
                VP8LPutBitsFlushBits(src);
              }
              iVar13 = src->used_;
              src->bits_ = src->bits_ | 3L << ((byte)iVar13 & 0x3f);
              src->used_ = iVar13 + 2;
              if (0x1d < iVar13) {
                VP8LPutBitsFlushBits(src);
              }
              src->bits_ = src->bits_ | (ulong)(iVar16 - 1) << ((byte)src->used_ & 0x3f);
              src->used_ = src->used_ + 8;
              uVar51 = (ulong)(iVar16 - 1);
              if (1 < iVar16) {
                do {
                  idx_map[uVar51] =
                       (palette[uVar51] | 0xff00) - (enc->palette_[uVar51 - 1] & 0xff00ff) &
                       0xff00ff |
                       (palette[uVar51] | 0xff0000) - (enc->palette_[uVar51 - 1] & 0xff00ff00) &
                       0xff00ff00;
                  bVar53 = 1 < (long)uVar51;
                  uVar51 = uVar51 - 1;
                } while (bVar53);
              }
              idx_map[0] = *palette;
              local_19f8._0_4_ =
                   EncodeImageNoHuffman(src,idx_map,hash_chain,refs,iVar16,1,0x14,uVar18);
              if ((WebPEncodingError)local_19f8 == VP8_ENC_OK) {
                pWVar9 = enc->pic_;
                uVar14 = pWVar9->width;
                iVar16 = pWVar9->height;
                puVar23 = pWVar9->argb;
                uVar35 = enc->palette_size_;
                uVar51 = (ulong)(int)uVar35;
                bVar34 = (long)uVar51 < 0x11;
                if ((long)uVar51 < 5) {
                  bVar34 = (long)uVar51 < 3 | 2;
                }
                uVar17 = pWVar9->argb_stride;
                WVar15 = AllocateTransformBuffer(enc,(uVar14 + (1 << bVar34)) - 1 >> bVar34,iVar16);
                local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
                if (WVar15 == VP8_ENC_OK) {
                  local_19f8 = enc->argb_;
                  uVar28 = enc->current_width_;
                  puVar22 = (uint8_t *)WebPSafeMalloc((long)(int)uVar14,1);
                  if (puVar22 == (uint8_t *)0x0) {
                    local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
                  }
                  else {
                    uVar39 = (ulong)uVar14;
                    iVar13 = (int)bVar34;
                    if ((int)uVar35 < 4) {
                      if (0 < iVar16) {
                        uVar35 = *palette;
                        iVar46 = 0;
                        bVar34 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            uVar51 = 0;
                            do {
                              uVar52 = puVar23[uVar51];
                              if (((uVar52 != uVar35) &&
                                  (bVar34 = 0, uVar35 = uVar52, *palette != uVar52)) &&
                                 (bVar34 = 1, enc->palette_[1] != uVar52)) {
                                bVar34 = enc->palette_[2] == uVar52 ^ 3;
                              }
                              puVar22[uVar51] = bVar34;
                              uVar51 = uVar51 + 1;
                            } while (uVar39 != uVar51);
                          }
                          (*VP8LBundleColorMap)(puVar22,uVar14,iVar13,local_19f8);
                          local_19f8 = local_19f8 + uVar28;
                          iVar46 = iVar46 + 1;
                          puVar23 = puVar23 + uVar17;
                        } while (iVar46 != iVar16);
                      }
                    }
                    else {
                      lVar32 = 0;
                      do {
                        memset(idx_map,0xff,0x1000);
                        pcVar10 = (code *)(&PTR_ApplyPaletteHash0_00164d50)[lVar32];
                        uVar30 = 0;
                        do {
                          uVar19 = (*pcVar10)(palette[uVar30]);
                          bVar53 = false;
                          if (*(short *)((long)idx_map + (ulong)uVar19 * 2) != -1) break;
                          *(short *)((long)idx_map + (ulong)uVar19 * 2) = (short)uVar30;
                          uVar30 = uVar30 + 1;
                          bVar53 = true;
                        } while (uVar30 < uVar51);
                        if (bVar53) {
                          iVar46 = (int)lVar32;
                          goto LAB_00140ad8;
                        }
                        lVar32 = lVar32 + 1;
                      } while (lVar32 != 3);
                      iVar46 = 3;
LAB_00140ad8:
                      if (iVar46 == 2) {
                        if (0 < iVar16) {
                          uVar19 = *palette;
                          uVar29 = 0;
                          iVar46 = 0;
                          do {
                            if (0 < (int)uVar14) {
                              uVar51 = 0;
                              do {
                                uVar27 = puVar23[uVar51];
                                if (uVar27 != uVar19) {
                                  uVar29 = *(undefined2 *)
                                            ((long)idx_map +
                                            (ulong)(uVar27 * -0x80000000 - (uVar27 & 0xffffff) >>
                                                   0x15) * 2);
                                  uVar19 = uVar27;
                                }
                                puVar22[uVar51] = (uint8_t)uVar29;
                                uVar51 = uVar51 + 1;
                              } while (uVar39 != uVar51);
                            }
                            (*VP8LBundleColorMap)(puVar22,uVar14,iVar13,local_19f8);
                            local_19f8 = local_19f8 + uVar28;
                            iVar46 = iVar46 + 1;
                            puVar23 = puVar23 + uVar17;
                          } while (iVar46 != iVar16);
                        }
                      }
                      else if (iVar46 == 1) {
                        if (0 < iVar16) {
                          uVar19 = *palette;
                          uVar29 = 0;
                          iVar46 = 0;
                          do {
                            if (0 < (int)uVar14) {
                              uVar51 = 0;
                              do {
                                uVar27 = puVar23[uVar51];
                                if (uVar27 != uVar19) {
                                  uVar29 = *(undefined2 *)
                                            ((long)idx_map +
                                            (ulong)((uVar27 & 0xffffff) * -0x455ab19 >> 0x15) * 2);
                                  uVar19 = uVar27;
                                }
                                puVar22[uVar51] = (uint8_t)uVar29;
                                uVar51 = uVar51 + 1;
                              } while (uVar39 != uVar51);
                            }
                            (*VP8LBundleColorMap)(puVar22,uVar14,iVar13,local_19f8);
                            local_19f8 = local_19f8 + uVar28;
                            iVar46 = iVar46 + 1;
                            puVar23 = puVar23 + uVar17;
                          } while (iVar46 != iVar16);
                        }
                      }
                      else if (iVar46 == 0) {
                        if (0 < iVar16) {
                          uVar19 = *palette;
                          uVar29 = 0;
                          iVar46 = 0;
                          do {
                            if (0 < (int)uVar14) {
                              uVar51 = 0;
                              do {
                                uVar27 = puVar23[uVar51];
                                if (uVar27 != uVar19) {
                                  uVar29 = *(undefined2 *)
                                            ((long)idx_map + (ulong)(uVar27 >> 8 & 0xff) * 2);
                                  uVar19 = uVar27;
                                }
                                puVar22[uVar51] = (uint8_t)uVar29;
                                uVar51 = uVar51 + 1;
                              } while (uVar39 != uVar51);
                            }
                            (*VP8LBundleColorMap)(puVar22,uVar14,iVar13,local_19f8);
                            local_19f8 = local_19f8 + uVar28;
                            iVar46 = iVar46 + 1;
                            puVar23 = puVar23 + uVar17;
                          } while (iVar46 != iVar16);
                        }
                      }
                      else {
                        PrepareMapToPalette(palette,uVar35,(uint32_t *)&hash_chain_histogram,
                                            palette_sorted);
                        if (0 < iVar16) {
                          uVar19 = *palette;
                          uVar52 = 0;
                          iVar46 = 0;
                          do {
                            if (0 < (int)uVar14) {
                              uVar51 = 0;
                              do {
                                uVar27 = puVar23[uVar51];
                                if (uVar27 != uVar19) {
                                  if ((uint)hash_chain_histogram.offset_length_ == uVar27) {
                                    lVar32 = 0;
                                  }
                                  else {
                                    uVar44 = 0;
                                    uVar52 = uVar35;
                                    do {
                                      uVar38 = (int)(uVar52 + uVar44) >> 1;
                                      uVar19 = *(uint *)((long)&hash_chain_histogram.offset_length_
                                                        + (long)(int)uVar38 * 4);
                                      bVar53 = uVar19 == uVar27;
                                      uVar41 = uVar44;
                                      if (uVar19 < uVar27) {
                                        uVar41 = uVar38;
                                      }
                                      if (bVar53) {
                                        uVar41 = uVar44;
                                      }
                                      uVar44 = uVar41;
                                      if (uVar19 >= uVar27 && !bVar53) {
                                        uVar52 = uVar38;
                                      }
                                    } while (!bVar53);
                                    lVar32 = (long)(int)uVar38;
                                  }
                                  uVar52 = palette_sorted[lVar32];
                                  uVar19 = uVar27;
                                }
                                puVar22[uVar51] = (uint8_t)uVar52;
                                uVar51 = uVar51 + 1;
                              } while (uVar51 != uVar39);
                            }
                            (*VP8LBundleColorMap)(puVar22,uVar14,iVar13,local_19f8);
                            puVar23 = puVar23 + uVar17;
                            local_19f8 = local_19f8 + uVar28;
                            iVar46 = iVar46 + 1;
                          } while (iVar46 != iVar16);
                        }
                      }
                    }
                    WebPSafeFree(puVar22);
                    local_19f8._0_4_ = VP8_ENC_OK;
                  }
                  enc->argb_content_ = kEncoderPalette;
                }
                if ((WebPEncodingError)local_19f8 == VP8_ENC_OK) {
                  if ((iVar3 != 0) && (uVar14 = enc->palette_size_, (int)uVar14 < 0x400)) {
                    uVar17 = 0x1f;
                    if (uVar14 != 0) {
                      for (; uVar14 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                      }
                    }
                    enc->cache_bits_ = (uVar17 ^ 0xffffffe0) + 0x21;
                  }
                  goto LAB_001403fe;
                }
              }
            }
            else {
              if (*(int *)(lVar49 + 4) == 0) {
                memcpy(palette,palette_00,(long)enc->palette_size_ << 2);
                goto LAB_001400ed;
              }
              uVar14 = enc->palette_size_;
              uVar51 = (ulong)uVar14;
              local_19f8._0_4_ = VP8_ENC_OK;
              bVar53 = true;
              if (1 < uVar51) {
                pWVar9 = enc->pic_;
                ptr = WebPSafeCalloc((ulong)(uVar14 * uVar14),4);
                local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
                if (ptr == (void *)0x0) {
                  bVar53 = false;
                }
                else {
                  puVar50 = pWVar9->argb;
                  uVar17 = *puVar50;
                  memset(idx_map,0,0x400);
                  ptr_00 = WebPSafeMalloc((long)pWVar9->width * 2,4);
                  if (ptr_00 == (void *)0x0) {
                    WebPSafeFree(ptr);
                    bVar53 = false;
                    local_19f8._0_4_ = VP8_ENC_ERROR_OUT_OF_MEMORY;
                  }
                  else {
                    iVar16 = pWVar9->width;
                    PrepareMapToPalette(palette_00,uVar14,palette_sorted,idx_map);
                    if (0 < pWVar9->height) {
                      uVar17 = ~uVar17;
                      uVar35 = 0;
                      iVar13 = 0;
                      pvVar11 = (void *)((long)ptr_00 + (long)iVar16 * 4);
                      pvVar31 = ptr_00;
                      do {
                        pvVar20 = pvVar11;
                        if (0 < pWVar9->width) {
                          lVar32 = 0;
                          do {
                            uVar28 = puVar50[lVar32];
                            if (uVar28 != uVar17) {
                              if (palette_sorted[0] == uVar28) {
                                lVar45 = 0;
                              }
                              else {
                                uVar39 = uVar51;
                                uVar17 = 0;
                                do {
                                  uVar36 = (int)((int)uVar39 + uVar17) >> 1;
                                  uVar19 = palette_sorted[(int)uVar36];
                                  bVar53 = uVar19 != uVar28;
                                  uVar27 = uVar17;
                                  if (uVar19 < uVar28) {
                                    uVar27 = uVar36;
                                  }
                                  if (!bVar53) {
                                    uVar27 = uVar17;
                                  }
                                  if (uVar19 >= uVar28 && bVar53) {
                                    uVar39 = (ulong)uVar36;
                                  }
                                  uVar17 = uVar27;
                                } while (bVar53);
                                lVar45 = (long)(int)uVar36;
                              }
                              uVar35 = idx_map[lVar45];
                              uVar17 = uVar28;
                            }
                            *(uint32_t *)((long)pvVar20 + lVar32 * 4) = uVar35;
                            if ((lVar32 != 0) &&
                               (uVar52 = *(uint32_t *)((long)pvVar20 + lVar32 * 4 + -4),
                               uVar35 != uVar52)) {
                              piVar1 = (int *)((long)ptr + (ulong)(uVar35 * uVar14 + uVar52) * 4);
                              *piVar1 = *piVar1 + 1;
                              piVar1 = (int *)((long)ptr + (ulong)(uVar52 * uVar14 + uVar35) * 4);
                              *piVar1 = *piVar1 + 1;
                            }
                            if ((iVar13 != 0) &&
                               (uVar52 = *(uint32_t *)((long)pvVar31 + lVar32 * 4), uVar35 != uVar52
                               )) {
                              piVar1 = (int *)((long)ptr + (ulong)(uVar35 * uVar14 + uVar52) * 4);
                              *piVar1 = *piVar1 + 1;
                              piVar1 = (int *)((long)ptr + (ulong)(uVar52 * uVar14 + uVar35) * 4);
                              *piVar1 = *piVar1 + 1;
                            }
                            lVar32 = lVar32 + 1;
                          } while (lVar32 < pWVar9->width);
                        }
                        puVar50 = puVar50 + pWVar9->argb_stride;
                        iVar13 = iVar13 + 1;
                        pvVar11 = pvVar31;
                        pvVar31 = pvVar20;
                      } while (iVar13 < pWVar9->height);
                    }
                    WebPSafeFree(ptr_00);
                    uVar19 = palette_sorted[0] >> 0x10;
                    lVar32 = 0;
                    uVar28 = 0;
                    uVar27 = 0;
                    uVar17 = 0;
                    do {
                      uVar39 = 0;
                      uVar36 = 0;
                      do {
                        uVar36 = uVar36 + *(int *)((long)ptr +
                                                  (ulong)(uint)((int)lVar32 + (int)uVar39) * 4);
                        uVar39 = uVar39 + 1;
                      } while (uVar51 != uVar39);
                      uVar28 = uVar28 & 0xff;
                      if (uVar17 < uVar36) {
                        uVar17 = uVar36;
                        uVar28 = uVar27;
                      }
                      uVar27 = uVar27 + 1;
                      lVar32 = lVar32 + uVar51;
                    } while (uVar27 != uVar14);
                    uVar36 = uVar28 & 0xff;
                    uVar39 = 0;
                    uVar27 = 0;
                    uVar17 = 0;
                    do {
                      uVar7 = *(uint *)((long)ptr + (ulong)(uVar14 * uVar36 + (uint)uVar39) * 4);
                      uVar27 = uVar27 & 0xff;
                      if (uVar17 < uVar7) {
                        uVar17 = uVar7;
                        uVar27 = (uint)uVar39;
                      }
                      uVar39 = uVar39 + 1;
                    } while (uVar51 != uVar39);
                    palette_sorted[0]._0_2_ = CONCAT11((char)uVar27,(char)uVar28);
                    palette_sorted[0] = CONCAT22((short)uVar19,(undefined2)palette_sorted[0]);
                    if (uVar14 - 2 == 0) {
                      uVar39 = 0;
                    }
                    else {
                      idx_map._0_8_ = ((ulong)idx_map._0_8_ >> 8 & 0xffffff) << 8;
                      uVar27 = uVar27 & 0xff;
                      uVar39 = (ulong)uVar27;
                      uVar30 = 0;
                      uVar17 = 0;
                      puVar23 = idx_map;
                      do {
                        if (((uVar28 & 0xff) != uVar30) && (uVar39 != uVar30)) {
                          uVar43 = (ulong)uVar17;
                          *(char *)(idx_map + uVar43 * 2) = (char)uVar30;
                          uVar19 = *(int *)((long)ptr + (ulong)uVar27 * 4) +
                                   *(int *)((long)ptr + (ulong)uVar36 * 4);
                          idx_map[uVar43 * 2 + 1] = uVar19;
                          if (puVar23[1] < uVar19) {
                            puVar23 = idx_map + uVar43 * 2;
                          }
                          uVar17 = uVar17 + 1;
                        }
                        uVar30 = uVar30 + 1;
                        uVar27 = uVar27 + uVar14;
                        uVar36 = uVar36 + uVar14;
                      } while (uVar14 + (uVar14 == 0) != uVar30);
                      uVar30 = (ulong)(uVar14 - 3);
                      uVar43 = (ulong)(uVar14 - 2);
                      uVar39 = 0;
                      iVar16 = 1;
                      uVar17 = 1;
                      do {
                        bVar34 = (byte)*puVar23;
                        uVar19 = uVar17 + 1;
                        uVar25 = uVar39 % uVar51;
                        uVar28 = uVar19;
                        if ((uint)uVar25 != uVar19) {
                          uVar27 = (uint)uVar39;
                          iVar46 = 0;
                          iVar13 = iVar16;
                          uVar36 = uVar27;
                          do {
                            uVar36 = uVar36 + 1;
                            iVar46 = iVar46 + *(int *)((long)ptr +
                                                      (ulong)((uint)*(byte *)((long)palette_sorted +
                                                                             uVar25) +
                                                             uVar14 * bVar34) * 4) * iVar13;
                            uVar25 = (ulong)uVar36 % uVar51;
                            iVar13 = iVar13 + -2;
                          } while ((uint)uVar25 != uVar19);
                          if (0 < iVar46) {
                            if (uVar27 == 0) {
                              uVar27 = uVar14;
                            }
                            uVar19 = uVar27 - 1;
                            uVar39 = (ulong)uVar19;
                            uVar28 = uVar17;
                          }
                        }
                        uVar17 = uVar28;
                        *(byte *)((long)palette_sorted + (ulong)uVar19) = bVar34;
                        *(undefined8 *)puVar23 = (&uStack_1040)[uVar43];
                        puVar23 = idx_map;
                        uVar43 = uVar43 - 1;
                        if (uVar43 != 0) {
                          puVar21 = idx_map;
                          uVar25 = 0;
                          puVar23 = puVar21;
                          do {
                            uVar28 = puVar21[1] +
                                     *(int *)((long)ptr +
                                             (ulong)((uint)(byte)*puVar21 + bVar34 * uVar14) * 4);
                            puVar21[1] = uVar28;
                            puVar12 = puVar21;
                            if (uVar28 <= puVar23[1]) {
                              puVar12 = puVar23;
                            }
                            puVar23 = puVar12;
                            uVar25 = uVar25 + 1;
                            puVar21 = puVar21 + 2;
                          } while (uVar30 != uVar25);
                        }
                        uVar30 = uVar30 - 1;
                        iVar16 = iVar16 + 1;
                      } while (uVar43 != 0);
                    }
                    WebPSafeFree(ptr);
                    uVar30 = 0;
                    do {
                      local_19f8._0_4_ = VP8_ENC_OK;
                      palette[uVar30] =
                           palette_00
                           [*(byte *)((long)palette_sorted +
                                     (ulong)(uint)((int)uVar39 + (int)uVar30) % uVar51)];
                      uVar30 = uVar30 + 1;
                    } while (uVar14 + (uVar14 == 0) != uVar30);
                    bVar53 = true;
                  }
                }
              }
              if (bVar53) goto LAB_001400ed;
            }
            bVar53 = false;
          }
        }
        if (!bVar53) goto LAB_00141513;
        uVar47 = uVar47 + 1;
      } while (uVar47 != uVar4);
    }
    VP8LBitWriterSwap(&bw_best,src);
  }
LAB_00141513:
  VP8LBitWriterWipeOut(&bw_best);
  *(WebPEncodingError *)((long)local_18e8 + 0x10c) = (WebPEncodingError)local_19f8;
  return (int)((WebPEncodingError)local_19f8 == VP8_ENC_OK);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const int use_cache = params->use_cache_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  WebPEncodingError err = VP8_ENC_OK;
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int use_delta_palette = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      err = AllocateTransformBuffer(enc, width, height);
      if (err != VP8_ENC_OK) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        err = VP8_ENC_ERROR_OUT_OF_MEMORY;
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (crunch_configs[idx].palette_sorting_type_ == kSortedDefault) {
        // Nothing to do, we have already sorted the palette.
        memcpy(enc->palette_, enc->palette_sorted_,
               enc->palette_size_ * sizeof(*enc->palette_));
      } else if (crunch_configs[idx].palette_sorting_type_ == kMinimizeDelta) {
        PaletteSortMinimizeDeltas(enc->palette_sorted_, enc->palette_size_,
                                  enc->palette_);
      } else {
        assert(crunch_configs[idx].palette_sorting_type_ == kModifiedZeng);
        err = PaletteSortModifiedZeng(enc->pic_, enc->palette_sorted_,
                                      enc->palette_size_, enc->palette_);
        if (err != VP8_ENC_OK) goto Error;
      }
      err = EncodePalette(bw, low_effort, enc);
      if (err != VP8_ENC_OK) goto Error;
      err = MapImageFromPalette(enc, use_delta_palette);
      if (err != VP8_ENC_OK) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (use_cache && enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    if (!use_delta_palette) {
      // In case image is not packed.
      if (enc->argb_content_ != kEncoderNearLossless &&
          enc->argb_content_ != kEncoderPalette) {
        err = MakeInputImageCopy(enc);
        if (err != VP8_ENC_OK) goto Error;
      }

      // -----------------------------------------------------------------------
      // Apply transforms and write transform data.

      if (enc->use_subtract_green_) {
        ApplySubtractGreen(enc, enc->current_width_, height, bw);
      }

      if (enc->use_predict_) {
        err = ApplyPredictFilter(enc, enc->current_width_, height, quality,
                                 low_effort, enc->use_subtract_green_, bw);
        if (err != VP8_ENC_OK) goto Error;
      }

      if (enc->use_cross_color_) {
        err = ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                    low_effort, bw);
        if (err != VP8_ENC_OK) goto Error;
      }
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    err = EncodeImageInternal(bw, enc->argb_, &enc->hash_chain_, enc->refs_,
                              enc->current_width_, height, quality, low_effort,
                              use_cache, &crunch_configs[idx],
                              &enc->cache_bits_, enc->histo_bits_,
                              byte_position, &hdr_size, &data_size);
    if (err != VP8_ENC_OK) goto Error;

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

Error:
  VP8LBitWriterWipeOut(&bw_best);
  params->err_ = err;
  // The hook should return false in case of error.
  return (err == VP8_ENC_OK);
}